

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

char * classend(MatchState *ms,char *p)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = p + 1;
  if (*p == '[') {
    if (p[1] == '^') {
      pcVar3 = p + 2;
    }
    cVar2 = p[(ulong)(p[1] == '^') + 1];
    do {
      if (cVar2 == '\0') {
        lj_err_caller(ms->L,LJ_ERR_STRPATM);
      }
      pcVar1 = pcVar3 + 1;
      if ((cVar2 == '%') && (pcVar3[1] != '\0')) {
        pcVar1 = pcVar3 + 2;
      }
      pcVar3 = pcVar1;
      cVar2 = *pcVar3;
    } while (cVar2 != ']');
    pcVar3 = pcVar3 + 1;
  }
  else if (*p == '%') {
    if (*pcVar3 == '\0') {
      lj_err_caller(ms->L,LJ_ERR_STRPATE);
    }
    pcVar3 = p + 2;
  }
  return pcVar3;
}

Assistant:

static const char *classend(MatchState *ms, const char *p)
{
  switch (*p++) {
  case L_ESC:
    if (*p == '\0')
      lj_err_caller(ms->L, LJ_ERR_STRPATE);
    return p+1;
  case '[':
    if (*p == '^') p++;
    do {  /* look for a `]' */
      if (*p == '\0')
	lj_err_caller(ms->L, LJ_ERR_STRPATM);
      if (*(p++) == L_ESC && *p != '\0')
	p++;  /* skip escapes (e.g. `%]') */
    } while (*p != ']');
    return p+1;
  default:
    return p;
  }
}